

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulative.cpp
# Opt level: O3

void __thiscall CumulativeProp::printStats(CumulativeProp *this)

{
  byte bVar1;
  
  fprintf(_stderr,"%% Cumulative propagator statistics");
  if ((this->name)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," for ",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  }
  fwrite(":\n",2,1,_stderr);
  fprintf(_stderr,"%%\t#TT incons.: %ld\n",this->nb_tt_incons);
  if (this->tt_filt == true) {
    fprintf(_stderr,"%%\t#TT prop.: %ld\n",this->nb_tt_filt);
  }
  if ((this->ttef_check != false) || (bVar1 = this->ttef_filt, (bool)bVar1 == true)) {
    fprintf(_stderr,"%%\t#TTEF incons.: %ld\n",this->nb_ttef_incons);
    bVar1 = this->ttef_filt;
  }
  if ((bVar1 & 1) == 0) {
    return;
  }
  fprintf(_stderr,"%%\t#TTEF prop.: %ld\n",this->nb_ttef_filt);
  return;
}

Assistant:

void printStats() override {
		fprintf(stderr, "%% Cumulative propagator statistics");
		if (!name.empty()) {
			std::cerr << " for " << name;
		}
		fprintf(stderr, ":\n");
		fprintf(stderr, "%%\t#TT incons.: %ld\n", nb_tt_incons);
		if (tt_filt) {
			fprintf(stderr, "%%\t#TT prop.: %ld\n", nb_tt_filt);
		}
		if (ttef_check || ttef_filt) {
			fprintf(stderr, "%%\t#TTEF incons.: %ld\n", nb_ttef_incons);
		}
		if (ttef_filt) {
			fprintf(stderr, "%%\t#TTEF prop.: %ld\n", nb_ttef_filt);
		}
	}